

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::MethodDescriptor::GetSourceLocation
          (MethodDescriptor *this,SourceLocation *out_location)

{
  bool bVar1;
  ServiceDescriptor *this_00;
  MethodDescriptor *in_RDI;
  SourceLocation *in_stack_00000038;
  vector<int,_std::allocator<int>_> path;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  MethodDescriptor *in_stack_ffffffffffffffb0;
  
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x62bfc7);
  GetLocationPath(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this_00 = service(in_RDI);
  ServiceDescriptor::file(this_00);
  bVar1 = FileDescriptor::GetSourceLocation
                    ((FileDescriptor *)
                     path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (vector<int,_std::allocator<int>_> *)
                     path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,in_stack_00000038);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  return bVar1;
}

Assistant:

bool MethodDescriptor::GetSourceLocation(SourceLocation* out_location) const {
  std::vector<int> path;
  GetLocationPath(&path);
  return service()->file()->GetSourceLocation(path, out_location);
}